

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O1

ColorTracker * __thiscall ColorTracker::getCaptureImage(ColorTracker *this)

{
  char cVar1;
  runtime_error *prVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150;
  ColorTracker *local_148;
  long lStack_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cv::Mat::Mat((Mat *)this);
  cVar1 = cv::VideoCapture::isOpened();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to open camera",0x15);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
               ,"");
    std::operator+(&local_90,"in ",&local_d0);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_110._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
      local_110.field_2._M_allocated_capacity = *psVar4;
      local_110.field_2._8_8_ = plVar3[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar4;
    }
    local_110._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::to_string(&local_b0,0x59);
    std::operator+(&local_70,&local_110,&local_b0);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_170._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_170._M_dataplus._M_p == psVar4) {
      local_170.field_2._M_allocated_capacity = *psVar4;
      local_170.field_2._8_4_ = (undefined4)plVar3[3];
      local_170.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar4;
    }
    local_170._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"getCaptureImage","");
    std::operator+(&local_50,&local_170,&local_f0);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_130 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (local_130 == plVar5) {
      local_120 = *plVar5;
      lStack_118 = plVar3[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar5;
    }
    local_128 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
    local_150 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (local_150 == plVar5) {
      lStack_140 = *plVar5;
      lStack_138 = plVar3[3];
      local_150 = &lStack_140;
    }
    else {
      lStack_140 = *plVar5;
    }
    local_148 = (ColorTracker *)plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(prVar2,(string *)&local_150);
    *(undefined ***)prVar2 = &PTR__runtime_error_0011e9b0;
    __cxa_throw(prVar2,&CameraException::typeinfo,std::runtime_error::~runtime_error);
  }
  lStack_140 = 0;
  local_150 = (long *)CONCAT44(local_150._4_4_,0x2010000);
  local_148 = this;
  cVar1 = cv::VideoCapture::read((_OutputArray *)(in_RSI + 8));
  if (cVar1 != '\0') {
    return this;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"failed to get frame",0x13);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,"");
  std::operator+(&local_90,"in ",&local_d0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_110._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
    local_110.field_2._M_allocated_capacity = *psVar4;
    local_110.field_2._8_8_ = plVar3[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar4;
  }
  local_110._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::to_string(&local_b0,0x5e);
  std::operator+(&local_70,&local_110,&local_b0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_170._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_170._M_dataplus._M_p == psVar4) {
    local_170.field_2._M_allocated_capacity = *psVar4;
    local_170.field_2._8_4_ = (undefined4)plVar3[3];
    local_170.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar4;
  }
  local_170._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"getCaptureImage","");
  std::operator+(&local_50,&local_170,&local_f0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_130 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_130 == plVar5) {
    local_120 = *plVar5;
    lStack_118 = plVar3[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar5;
  }
  local_128 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_150 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_150 == plVar5) {
    lStack_140 = *plVar5;
    lStack_138 = plVar3[3];
    local_150 = &lStack_140;
  }
  else {
    lStack_140 = *plVar5;
  }
  local_148 = (ColorTracker *)plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(prVar2,(string *)&local_150);
  *(undefined ***)prVar2 = &PTR__runtime_error_0011e9b0;
  __cxa_throw(prVar2,&CameraException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Mat ColorTracker::getCaptureImage() noexcept(false){
    Mat img;
    if(!this->cap.isOpened()){
        cout << "failed to open camera" << endl;
		throw CameraException(WHERE + "failed to open camera");
    } else {
        bool ret = this->cap.read(img);
        if(!ret){
            cout << "failed to get frame" << endl;
		    throw CameraException(WHERE + "failed to get frame");
        }
    }
    return img;

}